

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Matcher::MatchLeadingTrailingSpaces
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset)

{
  uint64 *puVar1;
  StandardChars<char16_t> *this_00;
  Program *pPVar2;
  code *pcVar3;
  bool bVar4;
  GroupInfo *pGVar5;
  undefined4 *puVar6;
  Type TVar7;
  CharCount CVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  
  pGVar5 = GroupIdToGroupInfo(this,0);
  if (inputLength < offset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x14ec,"(offset <= inputLength)","offset <= inputLength");
    if (!bVar4) goto LAB_00d460b5;
    *puVar6 = 0;
  }
  if ((((this->program).ptr)->flags & MultilineRegexFlag) != NoRegexFlags) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x14ed,"((program->flags & MultilineRegexFlag) == 0)",
                       "(program->flags & MultilineRegexFlag) == 0");
    if (!bVar4) goto LAB_00d460b5;
    *puVar6 = 0;
  }
  if (offset < inputLength) {
    this_00 = (this->standardChars).ptr;
    CVar8 = offset;
    if (offset == 0) {
      uVar10 = 0;
      while ((uVar11 = (ulong)inputLength, inputLength != uVar10 &&
             (bVar4 = StandardChars<char16_t>::IsWhitespaceOrNewline(this_00,input[uVar10]),
             uVar11 = uVar10, bVar4))) {
        if (this->stats != (Type)0x0) {
          puVar1 = &this->stats->numCompares;
          *puVar1 = *puVar1 + 1;
        }
        uVar10 = uVar10 + 1;
      }
      CVar8 = (CharCount)uVar11;
      if ((((this->program).ptr)->rep).boiLiteral2.literal <= CVar8) {
        offset = 0;
        goto LAB_00d4609a;
      }
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    uVar9 = 0;
    iVar12 = -1;
    while ((CVar8 <= inputLength + iVar12 &&
           (bVar4 = StandardChars<char16_t>::IsWhitespaceOrNewline
                              (this_00,input[inputLength + iVar12]), bVar4))) {
      if (inputLength - 1 == uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x1515,"(offset > 0)","offset > 0");
        if (!bVar4) goto LAB_00d460b5;
        *puVar6 = 0;
      }
      if (this->stats != (Type)0x0) {
        puVar1 = &this->stats->numCompares;
        *puVar1 = *puVar1 + 1;
      }
      uVar9 = uVar9 + 1;
      iVar12 = iVar12 + -1;
    }
    if (uVar9 < (((this->program).ptr)->rep).leadingTrailingSpaces.endMinMatch) {
      bVar4 = false;
      TVar7 = 0xffffffff;
      goto LAB_00d460a2;
    }
    offset = inputLength - uVar9;
    CVar8 = uVar9;
  }
  else {
    if (offset != inputLength) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x14f1,"(offset == inputLength)","offset == inputLength");
      if (!bVar4) {
LAB_00d460b5:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pPVar2 = (this->program).ptr;
    if ((pPVar2->rep).leadingTrailingSpaces.endMinMatch == 0) {
      CVar8 = 0;
    }
    else {
      TVar7 = 0xffffffff;
      if ((offset != 0) || (CVar8 = 0, (pPVar2->rep).boiLiteral2.literal != 0)) {
        bVar4 = false;
        goto LAB_00d460a2;
      }
    }
  }
LAB_00d4609a:
  TVar7 = CVar8;
  pGVar5->offset = offset;
  bVar4 = true;
LAB_00d460a2:
  pGVar5->length = TVar7;
  return bVar4;
}

Assistant:

inline bool Matcher::MatchLeadingTrailingSpaces(const Char* const input, const CharCount inputLength, CharCount offset)
    {
        GroupInfo* const info = GroupIdToGroupInfo(0);
        Assert(offset <= inputLength);
        Assert((program->flags & MultilineRegexFlag) == 0);

        if (offset >= inputLength)
        {
            Assert(offset == inputLength);
            if (program->rep.leadingTrailingSpaces.endMinMatch == 0 ||
                (offset == 0 && program->rep.leadingTrailingSpaces.beginMinMatch == 0))
            {
                info->offset = offset;
                info->length = 0;
                return true;
            }
            info->Reset();
            return false;
        }

        const StandardChars<Char> &stdchrs = *standardChars;
        if (offset == 0)
        {
            while (offset < inputLength && stdchrs.IsWhitespaceOrNewline(input[offset]))
            {
                offset++;
#if ENABLE_REGEX_CONFIG_OPTIONS
                CompStats();
#endif
            }
            if (offset >= program->rep.leadingTrailingSpaces.beginMinMatch)
            {
                info->offset = 0;
                info->length = offset;
                return true;
            }
        }

        Assert(inputLength > 0);
        const CharCount initOffset = offset;
        offset = inputLength - 1;
        while (offset >= initOffset && stdchrs.IsWhitespaceOrNewline(input[offset]))
        {
            // This can never underflow since initOffset > 0
            Assert(offset > 0);
            offset--;
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
        }
        offset++;
        CharCount length = inputLength - offset;
        if (length >= program->rep.leadingTrailingSpaces.endMinMatch)
        {
            info->offset = offset;
            info->length = length;
            return true;
        }
        info->Reset();
        return false;
    }